

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O0

UEnumeration * uenum_openUCharStringsEnumeration_63(UChar **strings,int32_t count,UErrorCode *ec)

{
  UBool UVar1;
  UEnumeration *local_28;
  UCharStringEnumeration *result;
  UErrorCode *ec_local;
  int32_t count_local;
  UChar **strings_local;
  
  local_28 = (UEnumeration *)0x0;
  UVar1 = U_SUCCESS(*ec);
  if (((UVar1 != '\0') && (-1 < count)) && ((count == 0 || (strings != (UChar **)0x0)))) {
    local_28 = (UEnumeration *)uprv_malloc_63(0x40);
    if (local_28 == (UEnumeration *)0x0) {
      *ec = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      memcpy(local_28,&UCHARSTRENUM_U_VT,0x38);
      local_28->context = strings;
      *(undefined4 *)&local_28[1].baseContext = 0;
      *(int32_t *)((long)&local_28[1].baseContext + 4) = count;
    }
  }
  return local_28;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
uenum_openUCharStringsEnumeration(const UChar* const strings[], int32_t count,
                                 UErrorCode* ec) {
    UCharStringEnumeration* result = NULL;
    if (U_SUCCESS(*ec) && count >= 0 && (count == 0 || strings != 0)) {
        result = (UCharStringEnumeration*) uprv_malloc(sizeof(UCharStringEnumeration));
        if (result == NULL) {
            *ec = U_MEMORY_ALLOCATION_ERROR;
        } else {
            U_ASSERT((char*)result==(char*)(&result->uenum));
            uprv_memcpy(result, &UCHARSTRENUM_U_VT, sizeof(UCHARSTRENUM_U_VT));
            result->uenum.context = (void*)strings;
            result->index = 0;
            result->count = count;
        }
    }
    return (UEnumeration*) result;
}